

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

Variable __thiscall
LiteScript::Class::CreateElement
          (Class *this,State *state,
          vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args,Variable *self)

{
  ClassObject *this_00;
  char *name;
  State *args_00;
  bool bVar1;
  Object *pOVar2;
  ulong uVar3;
  Type *pTVar4;
  uint *extraout_RDX;
  Variable *in_R8;
  long lVar5;
  undefined1 *t;
  Variable VVar6;
  uint local_ac;
  undefined1 local_98 [16];
  bool local_88 [8];
  bool *local_80;
  Variable *local_78;
  Variable *local_70;
  State *local_68;
  Type *local_60;
  undefined1 *local_58;
  Variable local_50;
  Variable local_40;
  
  local_78 = self;
  local_70 = in_R8;
  Memory::Create((Memory *)this,
                 (Type *)state[4].call_lifo.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  pOVar2 = Variable::operator->((Variable *)this);
  this_00 = (ClassObject *)pOVar2->data;
  this_00->ClassBase = (Class *)state;
  uVar3 = ((long)(state->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(state->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  local_68 = (State *)args;
  if ((int)uVar3 != 0) {
    t = _type_callback;
    local_58 = _type_nil;
    uVar3 = uVar3 & 0xffffffff;
    local_ac = 0;
    lVar5 = 0x20;
    local_60 = (Type *)_type_callback;
    do {
      pOVar2 = Variable::operator->
                         ((Variable *)
                          ((long)&(((state->args_tmp).
                                    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  )._M_impl.super__Vector_impl_data + lVar5));
      pTVar4 = Object::GetType(pOVar2);
      bVar1 = Type::operator!=(pTVar4,(Type *)t);
      if (bVar1) {
        name = *(char **)((long)(state->args_tmp).
                                super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x20);
        Memory::Create((Memory *)local_98,
                       (Type *)state[4].call_lifo.
                               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
        ClassObject::AddMember(this_00,name,(Variable *)local_98);
        Variable::~Variable((Variable *)local_98);
        Variable::Variable((Variable *)local_98,
                           &(this_00->members).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_ac].second);
        Variable::operator=(&local_40,(Variable *)local_98);
        Variable::~Variable(&local_40);
        Variable::~Variable((Variable *)local_98);
        local_ac = local_ac + 1;
        t = (undefined1 *)local_60;
      }
      lVar5 = lVar5 + 0x30;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  args_00 = local_68;
  lVar5 = (long)*(int *)&state[4].call_lifo.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 != -1) {
    pOVar2 = Variable::operator->
                       ((Variable *)
                        ((long)&(state->args_tmp).
                                super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar5 * 2 + 1].
                                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                ._M_impl.super__Vector_impl_data + 8));
    pTVar4 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar4,(Type *)_type_callback);
    if (bVar1) {
      local_80 = local_88;
      local_88[0] = false;
      Variable::Variable((Variable *)local_98,(Variable *)this);
      pOVar2 = Variable::operator->
                         ((Variable *)
                          ((long)&(state->args_tmp).
                                  super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)*(int *)&state[4].call_lifo.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 2 + 1]
                                  .
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  ._M_impl.super__Vector_impl_data + 8));
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)((long)pOVar2->data + 0x20),
                 (Nullable<LiteScript::Variable> *)local_98);
      if (local_88[0] == false) {
        Variable::~Variable((Variable *)local_98);
      }
      Variable::operator()
                (&local_50,
                 (State *)((long)&(state->args_tmp).
                                  super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)*(int *)&state[4].call_lifo.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 2 + 1]
                                  .
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  ._M_impl.super__Vector_impl_data + 8),
                 (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)args_00);
      Variable::~Variable(&local_50);
    }
  }
  this_00->ScriptState = args_00;
  Nullable<LiteScript::Variable>::operator=(&this_00->class_base,local_70);
  VVar6.nb_ref = extraout_RDX;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::Class::CreateElement(State& state, std::vector<Variable>& args, const Variable& self) {
    Variable v = this->memory.Create(Type::CLASS_OBJECT);
    ClassObject& co = v->GetData<ClassObject>();
    co.ClassBase = this;
    for (unsigned int i = 0, j = 0, sz = this->us_members.size(); i < sz; i++) {
        if (this->us_members[i].second->GetType() != Type::CALLBACK) {
            co.AddMember(this->us_members[i].first.c_str(), this->memory.Create(Type::NIL));
            co.GetMemberVariable(j) = this->us_members[i].second;
            j++;
        }
    }
    if (this->constructor_index != -1 && this->us_members[this->constructor_index].second->GetType() == Type::CALLBACK) {
        this->us_members[this->constructor_index].second->GetData<Callback>().This = Nullable<Variable>(v);
        this->us_members[this->constructor_index].second(state, args);
    }
    co.ScriptState = &state;
    co.class_base = self;
    return v;
}